

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

optional<QByteArrayView> * __thiscall
QHttpHeadersPrivate::findValue
          (optional<QByteArrayView> *__return_storage_ptr__,QHttpHeadersPrivate *this,
          HeaderName *name)

{
  char *pcVar1;
  bool bVar2;
  Header *pHVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool __ret;
  anon_class_16_2_9763bfdf local_50;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->headers).d.size;
  if (lVar4 == 0) {
    bVar2 = false;
  }
  else {
    pHVar3 = (this->headers).d.ptr;
    lVar4 = lVar4 * 0x38;
    do {
      local_39 = true;
      local_50.__ret = &local_39;
      local_50.__lhs = (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar3;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr
        [(long)(char)*(__index_type *)
                      ((long)&(name->data).
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                      + 0x18) + 1]._M_data)(&local_50,&name->data);
      if (local_39 != false) {
        pcVar1 = (pHVar3->value).d.ptr;
        (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size =
             (pHVar3->value).d.size;
        (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_data = pcVar1;
        bVar2 = true;
        goto LAB_0018ce3d;
      }
      pHVar3 = pHVar3 + 1;
      lVar4 = lVar4 + -0x38;
    } while (lVar4 != 0);
    bVar2 = false;
  }
LAB_0018ce3d:
  (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
  super__Optional_payload_base<QByteArrayView>._M_engaged = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

const noexcept
{
    for (const auto &h : headers) {
        if (h.name == name)
            return h.value;
    }
    return std::nullopt;
}